

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact)

{
  bool bVar1;
  allocator<char> local_61;
  OutputInfo *local_60;
  OutputInfo *info;
  string local_48;
  ArtifactType local_24;
  string *psStack_20;
  ArtifactType artifact_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  local_24 = artifact;
  psStack_20 = config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  bVar1 = IsImported(this);
  if (bVar1) {
    cmTarget::ImportedGetFullPath(&local_48,this->Target,psStack_20,local_24);
    cmsys::SystemTools::GetFilenamePath(__return_storage_ptr__,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    return __return_storage_ptr__;
  }
  local_60 = GetOutputInfo(this,psStack_20);
  if (local_60 != (OutputInfo *)0x0) {
    if (local_24 == RuntimeBinaryArtifact) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_60);
      return __return_storage_ptr__;
    }
    if (local_24 == ImportLibraryArtifact) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_60->ImpDir);
      return __return_storage_ptr__;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_61);
  std::allocator<char>::~allocator(&local_61);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetDirectory(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  if (this->IsImported()) {
    // Return the directory from which the target is imported.
    return cmSystemTools::GetFilenamePath(
      this->Target->ImportedGetFullPath(config, artifact));
  }
  if (OutputInfo const* info = this->GetOutputInfo(config)) {
    // Return the directory in which the target will be built.
    switch (artifact) {
      case cmStateEnums::RuntimeBinaryArtifact:
        return info->OutDir;
      case cmStateEnums::ImportLibraryArtifact:
        return info->ImpDir;
    }
  }
  return "";
}